

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O2

void background_work_sleep_once(tsdn_t *tsdn,background_thread_info_t *info,uint ind)

{
  _Bool _Var1;
  arena_t *arena;
  uint uVar2;
  int iVar3;
  uint64_t uVar4;
  uint64_t ns;
  uint i;
  ulong uVar5;
  nstime_t before_sleep;
  timespec ts;
  nstime_t ts_wakeup;
  nstime_t next_wakeup;
  timeval tv;
  
  uVar2 = duckdb_je_narenas_total_get();
  _Var1 = (info->indefinite_sleep).repr;
  uVar5 = 0xffffffffffffffff;
  for (; ind < uVar2; ind = ind + (int)duckdb_je_max_background_threads) {
    arena = (arena_t *)duckdb_je_arenas[ind].repr;
    if (arena != (arena_t *)0x0) {
      if ((_Var1 & 1U) == 0) {
        duckdb_je_arena_do_deferred_work(tsdn,arena);
      }
      if (100000000 < uVar5) {
        uVar4 = duckdb_je_pa_shard_time_until_deferred_work(tsdn,&arena->pa_shard);
        if (uVar4 < uVar5) {
          uVar5 = uVar4;
        }
      }
    }
  }
  info->tot_n_runs = info->tot_n_runs + 1;
  info->npages_to_purge_new = 0;
  gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
  duckdb_je_nstime_init2(&before_sleep,tv.tv_sec,tv.tv_usec * 1000);
  if (uVar5 == 0xffffffffffffffff) {
    (info->indefinite_sleep).repr = true;
    duckdb_je_nstime_init(&info->next_wakeup,0xffffffffffffffff);
    pthread_cond_wait((pthread_cond_t *)&info->cond,
                      (pthread_mutex_t *)((long)&(info->mtx).field_0 + 0x48));
  }
  else {
    uVar4 = 100000000;
    if (100000000 < uVar5) {
      uVar4 = uVar5;
    }
    duckdb_je_nstime_init_update(&next_wakeup);
    duckdb_je_nstime_iadd(&next_wakeup,uVar4);
    ns = duckdb_je_nstime_ns(&next_wakeup);
    (info->indefinite_sleep).repr = ns == 0xffffffffffffffff;
    duckdb_je_nstime_init(&info->next_wakeup,ns);
    duckdb_je_nstime_copy(&ts_wakeup,&before_sleep);
    duckdb_je_nstime_iadd(&ts_wakeup,uVar4);
    ts.tv_sec = duckdb_je_nstime_sec(&ts_wakeup);
    ts.tv_nsec = duckdb_je_nstime_nsec(&ts_wakeup);
    pthread_cond_timedwait
              ((pthread_cond_t *)&info->cond,(pthread_mutex_t *)((long)&(info->mtx).field_0 + 0x48),
               (timespec *)&ts);
  }
  gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
  duckdb_je_nstime_init2((nstime_t *)&ts,tv.tv_sec,tv.tv_usec * 1000);
  iVar3 = duckdb_je_nstime_compare((nstime_t *)&ts,&before_sleep);
  if (0 < iVar3) {
    duckdb_je_nstime_subtract((nstime_t *)&ts,&before_sleep);
    duckdb_je_nstime_add(&info->tot_sleep_time,(nstime_t *)&ts);
  }
  return;
}

Assistant:

static inline void
background_work_sleep_once(tsdn_t *tsdn, background_thread_info_t *info,
    unsigned ind) {
	uint64_t ns_until_deferred = BACKGROUND_THREAD_DEFERRED_MAX;
	unsigned narenas = narenas_total_get();
	bool slept_indefinitely = background_thread_indefinite_sleep(info);

	for (unsigned i = ind; i < narenas; i += max_background_threads) {
		arena_t *arena = arena_get(tsdn, i, false);
		if (!arena) {
			continue;
		}
		/*
		 * If thread was woken up from the indefinite sleep, don't
		 * do the work instantly, but rather check when the deferred
		 * work that caused this thread to wake up is scheduled for.
		 */
		if (!slept_indefinitely) {
			arena_do_deferred_work(tsdn, arena);
		}
		if (ns_until_deferred <= BACKGROUND_THREAD_MIN_INTERVAL_NS) {
			/* Min interval will be used. */
			continue;
		}
		uint64_t ns_arena_deferred = pa_shard_time_until_deferred_work(
		    tsdn, &arena->pa_shard);
		if (ns_arena_deferred < ns_until_deferred) {
			ns_until_deferred = ns_arena_deferred;
		}
	}

	uint64_t sleep_ns;
	if (ns_until_deferred == BACKGROUND_THREAD_DEFERRED_MAX) {
		sleep_ns = BACKGROUND_THREAD_INDEFINITE_SLEEP;
	} else {
		sleep_ns =
		    (ns_until_deferred < BACKGROUND_THREAD_MIN_INTERVAL_NS)
		    ? BACKGROUND_THREAD_MIN_INTERVAL_NS
		    : ns_until_deferred;

	}

	background_thread_sleep(tsdn, info, sleep_ns);
}